

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

void QuaternionToAxisAngle(Quaternion q,Vector3 *outAxis,float *outAngle)

{
  float fVar1;
  float fVar2;
  Quaternion QVar3;
  float den;
  float resAngle;
  Vector3 resAxis;
  float *outAngle_local;
  Vector3 *outAxis_local;
  Quaternion q_local;
  
  outAxis_local._0_4_ = q.x;
  outAxis_local._4_4_ = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  if (1.0 < ABS(q_local.y)) {
    QVar3 = QuaternionNormalize(q);
    resAxis._4_8_ = QVar3._0_8_;
    outAxis_local._0_4_ = QVar3.x;
    outAxis_local._4_4_ = QVar3.y;
    q_local.x = QVar3.z;
    q_local.y = QVar3.w;
  }
  memset(&den,0,0xc);
  fVar1 = acosf(q_local.y);
  fVar2 = sqrtf(-q_local.y * q_local.y + 1.0);
  if (fVar2 <= 0.0001) {
    den = 1.0;
  }
  else {
    den = outAxis_local._0_4_ / fVar2;
    resAngle = outAxis_local._4_4_ / fVar2;
    resAxis.x = q_local.x / fVar2;
  }
  outAxis->x = den;
  outAxis->y = resAngle;
  outAxis->z = resAxis.x;
  *outAngle = fVar1 * 2.0;
  return;
}

Assistant:

RMDEF void QuaternionToAxisAngle(Quaternion q, Vector3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = QuaternionNormalize(q);

    Vector3 resAxis = { 0.0f, 0.0f, 0.0f };
    float resAngle = 2.0f*acosf(q.w);
    float den = sqrtf(1.0f - q.w*q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x/den;
        resAxis.y = q.y/den;
        resAxis.z = q.z/den;
    }
    else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}